

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

spirv_cross * __thiscall
spirv_cross::join<char_const(&)[3],unsigned_int&>(spirv_cross *this,char (*ts) [3],uint *ts_1)

{
  undefined1 local_1110 [8];
  StringStream<4096UL,_4096UL> stream;
  uint *ts_local_1;
  char (*ts_local) [3];
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_1;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1110);
  inner::join_helper<char_const(&)[3],unsigned_int&>
            ((StringStream<4096UL,_4096UL> *)local_1110,ts,
             (uint *)stream.saved_buffers.stack_storage.aligned_char._184_8_);
  StringStream<4096ul,4096ul>::str_abi_cxx11_((StringStream<4096ul,4096ul> *)this);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1110);
  return this;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}